

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O3

void duckdb::MinMaxNOperation::
     Combine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxStringValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
               (ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,_duckdb::MinMaxStringValue,_duckdb::GreaterThan>
                *source,ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,_duckdb::MinMaxStringValue,_duckdb::GreaterThan>
                        *target,AggregateInputData *aggr_input)

{
  ArenaAllocator *this;
  idx_t iVar1;
  InvalidInputException *this_00;
  STORAGE_TYPE *__s;
  string local_48;
  
  if (source->is_initialized != true) {
    return;
  }
  if (target->is_initialized == false) {
    this = aggr_input->allocator;
    iVar1 = (source->heap).capacity;
    (target->heap).capacity = iVar1;
    __s = (STORAGE_TYPE *)ArenaAllocator::AllocateAligned(this,iVar1 * 0x28);
    switchD_00569a20::default(__s,0,(target->heap).capacity * 0x28);
    (target->heap).heap = __s;
    (target->heap).size = 0;
    target->is_initialized = true;
  }
  else if ((source->heap).capacity != (target->heap).capacity) {
    this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Mismatched n values in min/max/arg_min/arg_max","");
    InvalidInputException::InvalidInputException(this_00,&local_48);
    __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  BinaryAggregateHeap<duckdb::string_t,_int,_duckdb::GreaterThan>::Insert
            (&target->heap,aggr_input->allocator,&source->heap);
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &aggr_input) {
		if (!source.is_initialized) {
			// source is empty, nothing to do
			return;
		}

		if (!target.is_initialized) {
			target.Initialize(aggr_input.allocator, source.heap.Capacity());
		} else if (source.heap.Capacity() != target.heap.Capacity()) {
			throw InvalidInputException("Mismatched n values in min/max/arg_min/arg_max");
		}

		// Merge the heaps
		target.heap.Insert(aggr_input.allocator, source.heap);
	}